

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FullSegment.hpp
# Opt level: O0

void __thiscall
cppjieba::FullSegment::Cut
          (FullSegment *this,const_iterator begin,const_iterator end,
          vector<cppjieba::WordRange,_std::allocator<cppjieba::WordRange>_> *res)

{
  ulong uVar1;
  size_type sVar2;
  reference pvVar3;
  size_t sVar4;
  pair<unsigned_long,_const_cppjieba::DictUnit_*> *ppVar5;
  size_t local_200;
  undefined1 local_1c0 [8];
  WordRange wr_1;
  WordRange wr;
  DictUnit *du;
  size_t nextoffset;
  size_t j;
  size_t i;
  undefined1 local_170 [8];
  vector<cppjieba::Dag,_std::allocator<cppjieba::Dag>_> dags;
  size_t wordLen;
  size_t uIdx;
  size_t maxIdx;
  LocalVector<std::pair<unsigned_long,_const_cppjieba::DictUnit_*>_> tRes;
  vector<cppjieba::WordRange,_std::allocator<cppjieba::WordRange>_> *res_local;
  const_iterator end_local;
  const_iterator begin_local;
  FullSegment *this_local;
  
  tRes.capacity_ = (size_t)res;
  limonp::LocalVector<std::pair<unsigned_long,_const_cppjieba::DictUnit_*>_>::LocalVector
            ((LocalVector<std::pair<unsigned_long,_const_cppjieba::DictUnit_*>_> *)&maxIdx);
  uIdx = 0;
  wordLen = 0;
  dags.super__Vector_base<cppjieba::Dag,_std::allocator<cppjieba::Dag>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  if (this->dictTrie_ == (DictTrie *)0x0) {
    __assert_fail("dictTrie_",
                  "/workspace/llm4binary/github/license_all_cmakelists_1510/qiangsiwei[P]jiebac/cppjieba/FullSegment.hpp"
                  ,0x3e,
                  "void cppjieba::FullSegment::Cut(RuneStrArray::const_iterator, RuneStrArray::const_iterator, vector<WordRange> &) const"
                 );
  }
  std::vector<cppjieba::Dag,_std::allocator<cppjieba::Dag>_>::vector
            ((vector<cppjieba::Dag,_std::allocator<cppjieba::Dag>_> *)local_170);
  DictTrie::Find(this->dictTrie_,begin,end,
                 (vector<cppjieba::Dag,_std::allocator<cppjieba::Dag>_> *)local_170,0x200);
  j = 0;
  do {
    sVar2 = std::vector<cppjieba::Dag,_std::allocator<cppjieba::Dag>_>::size
                      ((vector<cppjieba::Dag,_std::allocator<cppjieba::Dag>_> *)local_170);
    if (sVar2 <= j) {
      std::vector<cppjieba::Dag,_std::allocator<cppjieba::Dag>_>::~vector
                ((vector<cppjieba::Dag,_std::allocator<cppjieba::Dag>_> *)local_170);
      limonp::LocalVector<std::pair<unsigned_long,_const_cppjieba::DictUnit_*>_>::~LocalVector
                ((LocalVector<std::pair<unsigned_long,_const_cppjieba::DictUnit_*>_> *)&maxIdx);
      return;
    }
    nextoffset = 0;
    while( true ) {
      pvVar3 = std::vector<cppjieba::Dag,_std::allocator<cppjieba::Dag>_>::operator[]
                         ((vector<cppjieba::Dag,_std::allocator<cppjieba::Dag>_> *)local_170,j);
      sVar4 = limonp::LocalVector<std::pair<unsigned_long,_const_cppjieba::DictUnit_*>_>::size
                        (&pvVar3->nexts);
      if (sVar4 <= nextoffset) break;
      pvVar3 = std::vector<cppjieba::Dag,_std::allocator<cppjieba::Dag>_>::operator[]
                         ((vector<cppjieba::Dag,_std::allocator<cppjieba::Dag>_> *)local_170,j);
      ppVar5 = limonp::LocalVector<std::pair<unsigned_long,_const_cppjieba::DictUnit_*>_>::
               operator[](&pvVar3->nexts,nextoffset);
      uVar1 = ppVar5->first;
      sVar2 = std::vector<cppjieba::Dag,_std::allocator<cppjieba::Dag>_>::size
                        ((vector<cppjieba::Dag,_std::allocator<cppjieba::Dag>_> *)local_170);
      if (sVar2 <= uVar1) {
        __assert_fail("nextoffset < dags.size()",
                      "/workspace/llm4binary/github/license_all_cmakelists_1510/qiangsiwei[P]jiebac/cppjieba/FullSegment.hpp"
                      ,0x44,
                      "void cppjieba::FullSegment::Cut(RuneStrArray::const_iterator, RuneStrArray::const_iterator, vector<WordRange> &) const"
                     );
      }
      pvVar3 = std::vector<cppjieba::Dag,_std::allocator<cppjieba::Dag>_>::operator[]
                         ((vector<cppjieba::Dag,_std::allocator<cppjieba::Dag>_> *)local_170,j);
      ppVar5 = limonp::LocalVector<std::pair<unsigned_long,_const_cppjieba::DictUnit_*>_>::
               operator[](&pvVar3->nexts,nextoffset);
      if (ppVar5->second == (DictUnit *)0x0) {
        pvVar3 = std::vector<cppjieba::Dag,_std::allocator<cppjieba::Dag>_>::operator[]
                           ((vector<cppjieba::Dag,_std::allocator<cppjieba::Dag>_> *)local_170,j);
        sVar4 = limonp::LocalVector<std::pair<unsigned_long,_const_cppjieba::DictUnit_*>_>::size
                          (&pvVar3->nexts);
        if ((sVar4 == 1) && (uIdx <= wordLen)) {
          WordRange::WordRange((WordRange *)&wr_1.right,begin + j,begin + uVar1);
          std::vector<cppjieba::WordRange,_std::allocator<cppjieba::WordRange>_>::push_back
                    ((vector<cppjieba::WordRange,_std::allocator<cppjieba::WordRange>_> *)
                     tRes.capacity_,(value_type *)&wr_1.right);
        }
      }
      else {
        dags.super__Vector_base<cppjieba::Dag,_std::allocator<cppjieba::Dag>_>._M_impl.
        super__Vector_impl_data._M_end_of_storage =
             (pointer)limonp::LocalVector<unsigned_int>::size(&ppVar5->second->word);
        if (dags.super__Vector_base<cppjieba::Dag,_std::allocator<cppjieba::Dag>_>._M_impl.
            super__Vector_impl_data._M_end_of_storage < (pointer)0x2) {
          pvVar3 = std::vector<cppjieba::Dag,_std::allocator<cppjieba::Dag>_>::operator[]
                             ((vector<cppjieba::Dag,_std::allocator<cppjieba::Dag>_> *)local_170,j);
          sVar4 = limonp::LocalVector<std::pair<unsigned_long,_const_cppjieba::DictUnit_*>_>::size
                            (&pvVar3->nexts);
          if ((sVar4 != 1) || (wordLen < uIdx)) goto LAB_0011ee29;
        }
        WordRange::WordRange((WordRange *)local_1c0,begin + j,begin + uVar1);
        std::vector<cppjieba::WordRange,_std::allocator<cppjieba::WordRange>_>::push_back
                  ((vector<cppjieba::WordRange,_std::allocator<cppjieba::WordRange>_> *)
                   tRes.capacity_,(value_type *)local_1c0);
      }
LAB_0011ee29:
      if (uIdx < (long)((dags.super__Vector_base<cppjieba::Dag,_std::allocator<cppjieba::Dag>_>.
                         _M_impl.super__Vector_impl_data._M_end_of_storage)->nexts).buffer_ +
                 (wordLen - 0x18)) {
        local_200 = (long)((dags.super__Vector_base<cppjieba::Dag,_std::allocator<cppjieba::Dag>_>.
                            _M_impl.super__Vector_impl_data._M_end_of_storage)->nexts).buffer_ +
                    (wordLen - 0x18);
      }
      else {
        local_200 = uIdx;
      }
      uIdx = local_200;
      nextoffset = nextoffset + 1;
    }
    wordLen = wordLen + 1;
    j = j + 1;
  } while( true );
}

Assistant:

void Cut(RuneStrArray::const_iterator begin, 
        RuneStrArray::const_iterator end, 
        vector<WordRange>& res) const {
    // resut of searching in trie tree
    LocalVector<pair<size_t, const DictUnit*> > tRes;

    // max index of res's words
    size_t maxIdx = 0;

    // always equals to (uItr - begin)
    size_t uIdx = 0;

    // tmp variables
    size_t wordLen = 0;
    assert(dictTrie_);
    vector<struct Dag> dags;
    dictTrie_->Find(begin, end, dags);
    for (size_t i = 0; i < dags.size(); i++) {
      for (size_t j = 0; j < dags[i].nexts.size(); j++) {
        size_t nextoffset = dags[i].nexts[j].first;
        assert(nextoffset < dags.size());
        const DictUnit* du = dags[i].nexts[j].second;
        if (du == NULL) {
          if (dags[i].nexts.size() == 1 && maxIdx <= uIdx) {
            WordRange wr(begin + i, begin + nextoffset);
            res.push_back(wr);
          }
        } else {
          wordLen = du->word.size();
          if (wordLen >= 2 || (dags[i].nexts.size() == 1 && maxIdx <= uIdx)) {
            WordRange wr(begin + i, begin + nextoffset);
            res.push_back(wr);
          }
        }
        maxIdx = uIdx + wordLen > maxIdx ? uIdx + wordLen : maxIdx;
      }
      uIdx++;
    }
  }